

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.c
# Opt level: O0

HT_Timeline * ht_global_timeline_get(void)

{
  pthread_key_t __key;
  long lVar1;
  HT_Timeline *pHVar2;
  
  lVar1 = __tls_get_addr(&PTR_00110fa8);
  if (*(long *)(lVar1 + 8) == 0) {
    pHVar2 = _ht_global_timeline_create();
    lVar1 = __tls_get_addr(&PTR_00110fa8);
    *(HT_Timeline **)(lVar1 + 8) = pHVar2;
    pthread_once(&timeline_once_control,create_key);
    __key = timeline_key;
    lVar1 = __tls_get_addr(&PTR_00110fa8);
    pthread_setspecific(__key,*(void **)(lVar1 + 8));
  }
  lVar1 = __tls_get_addr(&PTR_00110fa8);
  return *(HT_Timeline **)(lVar1 + 8);
}

Assistant:

HT_Timeline* ht_global_timeline_get(void)
{
    static HT_THREAD_LOCAL HT_Timeline* c_timeline = NULL;

    if (!c_timeline)
    {
        c_timeline = _ht_global_timeline_create();
        pthread_once(&timeline_once_control, create_key);
        pthread_setspecific(timeline_key, c_timeline);
    }

    return c_timeline;
}